

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

bool Catch::shouldShowDuration(IConfig *config,double duration)

{
  int iVar1;
  long *in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  double min;
  bool local_21;
  bool local_1;
  
  iVar1 = (**(code **)(*in_RDI + 0x58))();
  if (iVar1 == 1) {
    local_1 = true;
  }
  else {
    iVar1 = (**(code **)(*in_RDI + 0x58))();
    if (iVar1 == 2) {
      local_1 = false;
    }
    else {
      dVar2 = (double)(**(code **)(*in_RDI + 0x60))();
      local_21 = 0.0 <= dVar2 && dVar2 <= in_XMM0_Qa;
      local_1 = local_21;
    }
  }
  return local_1;
}

Assistant:

bool shouldShowDuration( IConfig const& config, double duration ) {
        if ( config.showDurations() == ShowDurations::Always ) {
            return true;
        }
        if ( config.showDurations() == ShowDurations::Never ) {
            return false;
        }
        const double min = config.minDuration();
        return min >= 0 && duration >= min;
    }